

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_free_table(char **azResult)

{
  undefined8 uVar1;
  long in_RDI;
  int n;
  int i;
  int local_c;
  
  if (in_RDI != 0) {
    uVar1 = *(undefined8 *)(in_RDI + -8);
    for (local_c = 1; local_c < (int)uVar1; local_c = local_c + 1) {
      if (((undefined8 *)(in_RDI + -8))[local_c] != 0) {
        sqlite3_free((void *)0x146bc5);
      }
    }
    sqlite3_free((void *)0x146bde);
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_free_table(
  char **azResult            /* Result returned from sqlite3_get_table() */
){
  if( azResult ){
    int i, n;
    azResult--;
    assert( azResult!=0 );
    n = SQLITE_PTR_TO_INT(azResult[0]);
    for(i=1; i<n; i++){ if( azResult[i] ) sqlite3_free(azResult[i]); }
    sqlite3_free(azResult);
  }
}